

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

VmType GetVmType(ExpressionContext *ctx,TypeBase *type)

{
  VmType VVar1;
  undefined4 in_EAX;
  int iVar2;
  ulong uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  VmType VVar6;
  
  if (ctx->typeVoid == type) {
    uVar3 = 0;
    goto LAB_001a5481;
  }
  auVar5._0_4_ = -(uint)(type == ctx->typeBool);
  auVar5._4_4_ = -(uint)(type == ctx->typeChar);
  auVar5._8_4_ = -(uint)(type == ctx->typeShort);
  auVar5._12_4_ = -(uint)(type == ctx->typeInt);
  iVar2 = movmskps(in_EAX,auVar5);
  if (iVar2 != 0) {
switchD_001a54d6_caseD_9:
    return (VmType)ZEXT816(0x400000001);
  }
  if (ctx->typeLong == type) {
    return (VmType)ZEXT816(0x800000003);
  }
  if (ctx->typeFloat == type) {
    return (VmType)ZEXT816(0x800000002);
  }
  if (ctx->typeDouble == type) {
    return (VmType)ZEXT816(0x800000002);
  }
  if (type == (TypeBase *)0x0) {
switchD_001a54d6_caseD_c:
    __assert_fail("!\"unknown type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x9b2,"VmType GetVmType(ExpressionContext &, TypeBase *)");
  }
  switch(type->typeID) {
  case 9:
  case 10:
  case 0x19:
    goto switchD_001a54d6_caseD_9;
  case 0xb:
  case 0x12:
    uVar4 = 0x800000006;
    break;
  default:
    goto switchD_001a54d6_caseD_c;
  case 0x10:
    uVar3 = 0xc00000009;
    goto LAB_001a5481;
  case 0x11:
    uVar3 = 0x100000000a;
LAB_001a5481:
    VVar6.structType = (TypeBase *)0x0;
    VVar6.type = (int)uVar3;
    VVar6.size = (int)(uVar3 >> 0x20);
    return VVar6;
  case 0x13:
  case 0x18:
    uVar3 = type->size;
    if ((uVar3 & 3) != 0) {
      __assert_fail("type->size % 4 == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x9a9,"VmType GetVmType(ExpressionContext &, TypeBase *)");
    }
    if ((long)uVar3 < 0x10000000) {
      VVar6 = VmType::Struct(uVar3,type);
      return VVar6;
    }
    __assert_fail("type->size < NULLC_MAX_TYPE_SIZE",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x9aa,"VmType GetVmType(ExpressionContext &, TypeBase *)");
  case 0x14:
    uVar4 = 0xc00000008;
    break;
  case 0x15:
    uVar4 = 0xc00000007;
  }
  VVar1.structType = type;
  VVar1.type = (int)uVar4;
  VVar1.size = (int)((ulong)uVar4 >> 0x20);
  return VVar1;
}

Assistant:

VmType GetVmType(ExpressionContext &ctx, TypeBase *type)
{
	if(type == ctx.typeVoid)
		return VmType::Void;

	if(type == ctx.typeBool || type == ctx.typeChar || type == ctx.typeShort || type == ctx.typeInt)
		return VmType::Int;

	if(type == ctx.typeLong)
		return VmType::Long;

	if(type == ctx.typeFloat || type == ctx.typeDouble)
		return VmType::Double;

	if(isType<TypeRef>(type))
		return VmType::Pointer(type);

	if(isType<TypeFunction>(type))
		return VmType::FunctionRef(type);

	if(isType<TypeUnsizedArray>(type))
		return VmType::ArrayRef(type);

	if(isType<TypeAutoRef>(type))
		return VmType::AutoRef;

	if(isType<TypeAutoArray>(type))
		return VmType::AutoArray;

	if(isType<TypeTypeID>(type))
		return VmType::Int;

	if(isType<TypeFunctionID>(type))
		return VmType::Int;

	if(isType<TypeNullptr>(type))
		return VmType::Pointer(type);

	if(isType<TypeArray>(type) || isType<TypeClass>(type))
	{
		assert(type->size % 4 == 0);
		assert(type->size < NULLC_MAX_TYPE_SIZE);

		return VmType::Struct(type->size, type);
	}

	if(isType<TypeEnum>(type))
		return VmType::Int;

	assert(!"unknown type");

	return VmType::Void;
}